

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

option * __thiscall
CLOptions::DefineOptSingle(CLOptions *this,string *name,int has_arg,int *flag,char val)

{
  bool bVar1;
  int in_ECX;
  option *in_RDI;
  int *in_R8;
  char in_R9B;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *pcVar2;
  
  bVar1 = std::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
  }
  else {
    pcVar2 = (char *)0x0;
  }
  in_RDI->name = pcVar2;
  in_RDI->has_arg = in_ECX;
  in_RDI->flag = in_R8;
  in_RDI->val = (int)in_R9B;
  return in_RDI;
}

Assistant:

struct option CLOptions::DefineOptSingle(const std::string& name, int has_arg, int *flag, char val)
{
    struct option new_opt ;
    new_opt.name = (name != "") ? name.c_str() : 0 ;
    new_opt.has_arg = has_arg ;
    new_opt.flag = flag ;
    new_opt.val = val;
    
    return new_opt ;
}